

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

void __thiscall QAbstractSpinBox::setReadOnly(QAbstractSpinBox *this,bool enable)

{
  long lVar1;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  *(ushort *)(lVar1 + 0x3d0) =
       ((ushort)*(undefined4 *)(lVar1 + 0x3d0) & 0xfffd) +
       (short)CONCAT71(in_register_00000031,enable) * 2;
  QLineEdit::setReadOnly(*(QLineEdit **)(lVar1 + 0x378),enable);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_28,ReadOnlyChange);
  QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_28);
  QWidget::update((QWidget *)this);
  QEvent::~QEvent((QEvent *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::setReadOnly(bool enable)
{
    Q_D(QAbstractSpinBox);
    d->readOnly = enable;
    d->edit->setReadOnly(enable);
    QEvent event(QEvent::ReadOnlyChange);
    QCoreApplication::sendEvent(this, &event);
    update();
}